

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_boolean_t is_arduino_board(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  uint *puVar3;
  size_t sVar4;
  mraa_boolean_t mVar5;
  char *__fmt;
  long lVar6;
  char gpiochip_label_arduino [10];
  char gpiochip_path [64];
  char gpiochip_label [64];
  char format_str [64];
  char local_108 [16];
  char local_f8 [64];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  char local_78 [72];
  
  builtin_strncpy(local_108,"pcal9555a",10);
  mVar5 = 0;
  snprintf(local_78,0x40,"%%%ds",0x3f);
  tristate = mraa_gpio_init_raw(0xd6);
  if (tristate == (mraa_gpio_context)0x0) {
    syslog(6,"edison: tristate not detected");
  }
  else {
    lVar6 = 0;
    do {
      local_f8[0x30] = '\0';
      local_f8[0x31] = '\0';
      local_f8[0x32] = '\0';
      local_f8[0x33] = '\0';
      local_f8[0x34] = '\0';
      local_f8[0x35] = '\0';
      local_f8[0x36] = '\0';
      local_f8[0x37] = '\0';
      local_f8[0x38] = '\0';
      local_f8[0x39] = '\0';
      local_f8[0x3a] = '\0';
      local_f8[0x3b] = '\0';
      local_f8[0x3c] = '\0';
      local_f8[0x3d] = '\0';
      local_f8[0x3e] = '\0';
      local_f8[0x3f] = '\0';
      local_f8[0x20] = '\0';
      local_f8[0x21] = '\0';
      local_f8[0x22] = '\0';
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      local_f8[0x28] = '\0';
      local_f8[0x29] = '\0';
      local_f8[0x2a] = '\0';
      local_f8[0x2b] = '\0';
      local_f8[0x2c] = '\0';
      local_f8[0x2d] = '\0';
      local_f8[0x2e] = '\0';
      local_f8[0x2f] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = '\0';
      local_f8[0x19] = '\0';
      local_f8[0x1a] = '\0';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = '\0';
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = '\0';
      local_f8[9] = '\0';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      snprintf(local_f8,0x40,"/sys/class/gpio/gpiochip%d/label",
               (ulong)*(uint *)((long)&DAT_00129cc0 + lVar6));
      __stream = fopen(local_f8,"r");
      if (__stream == (FILE *)0x0) {
        puVar3 = (uint *)__errno_location();
        uVar1 = *puVar3;
        __fmt = "edison: could not open \'%s\', errno %d";
LAB_001191f4:
        syslog(6,__fmt,local_f8,(ulong)uVar1);
        return 0;
      }
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      iVar2 = __isoc99_fscanf(__stream,local_78,&local_b8);
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      fclose(__stream);
      if (iVar2 != 1) {
        __fmt = "edison: could not read from \'%s\', errno %d";
        goto LAB_001191f4;
      }
      sVar4 = strlen((char *)&local_b8);
      iVar2 = strncmp((char *)&local_b8,local_108,sVar4 + 1);
      if (iVar2 != 0) {
        syslog(6,"edison: gpiochip label (%s) is not what we expect (%s)\n",&local_b8,local_108);
        return 0;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    syslog(5,"edison: Arduino board detected");
    mVar5 = 1;
  }
  return mVar5;
}

Assistant:

mraa_boolean_t
is_arduino_board()
{
    // We check for two things to determine if that's an Arduino expansion board
    // 1) is tristate GPIO available, by trying to initialize it
    // 2) are there four specific GPIO expanders, by reading device labels
    //        /sys/class/gpio/gpiochip{200,216,232,248}/label == "pcal9555a"
    char gpiochip_path[MAX_SIZE];
    char gpiochip_label[MAX_SIZE];
    const char gpiochip_label_arduino[] = "pcal9555a";
    const int gpiochip_idx[4] = { 200, 216, 232, 248 };

    // prepare format string for fscanf, based on MAX_SIZE
    char format_str[MAX_SIZE];
    snprintf(format_str, MAX_SIZE, "%%%ds", MAX_SIZE - 1);
    int i, ret, errno_saved;

    // check tristate first
    tristate = mraa_gpio_init_raw(214);
    if (tristate == NULL) {
        syslog(LOG_INFO, "edison: tristate not detected");
        return 0;
    }

    // GPIO expanders second
    for (i=0; i<(sizeof(gpiochip_idx)/sizeof(gpiochip_idx[0])); i++) {
        memset(gpiochip_path, 0, MAX_SIZE);
        snprintf(gpiochip_path,
                 MAX_SIZE,
                 SYSFS_CLASS_GPIO "/gpiochip%d/label",
                 gpiochip_idx[i]);
        FILE *fp;
        fp = fopen(gpiochip_path, "r");
        if (fp == NULL) {
            syslog(LOG_INFO,
                   "edison: could not open '%s', errno %d",
                   gpiochip_path,
                   errno);
            return 0;
        }

        memset(gpiochip_label, 0, MAX_SIZE);
        ret = fscanf(fp, format_str, &gpiochip_label);
        errno_saved = errno;
        fclose(fp);
        if (ret != 1) {
            syslog(LOG_INFO,
                   "edison: could not read from '%s', errno %d",
                   gpiochip_path,
                   errno_saved);
            return 0;
        }

        // we want to check for exact match
        if (strncmp(gpiochip_label, gpiochip_label_arduino, strlen(gpiochip_label) + 1) != 0) {
            syslog(LOG_INFO,
                   "edison: gpiochip label (%s) is not what we expect (%s)\n",
                   gpiochip_label,
                   gpiochip_label_arduino);
            return 0;
        }
    }

    syslog(LOG_NOTICE, "edison: Arduino board detected");
    return 1;
}